

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O0

nfa_state_t * __thiscall re2c::CloseOp::compile(CloseOp *this,nfa_t *nfa,nfa_state_t *t)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  nfa_state_t *this_00;
  nfa_state_t *s;
  nfa_state_t *t_local;
  nfa_t *nfa_local;
  CloseOp *this_local;
  
  uVar1 = nfa->size;
  nfa->size = uVar1 + 1;
  this_00 = nfa->states + uVar1;
  iVar2 = (*this->exp->_vptr_RegExp[5])(this->exp,nfa,this_00);
  nfa_state_t::alt(this_00,t,(nfa_state_t *)CONCAT44(extraout_var,iVar2));
  return this_00;
}

Assistant:

nfa_state_t *CloseOp::compile(nfa_t &nfa, nfa_state_t *t)
{
	nfa_state_t *s = &nfa.states[nfa.size++];
	s->alt(t, exp->compile(nfa, s));
	return s;
}